

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O0

pair<unsigned_long,_bool> __thiscall
cmComputeLinkDepends::AddLinkEntry(cmComputeLinkDepends *this,cmLinkItem *item,size_t groupIndex)

{
  string_view sVar1;
  string_view str;
  bool bVar2;
  pointer ppVar3;
  string *psVar4;
  char *pcVar5;
  reference pvVar6;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar7;
  pair<std::_Rb_tree_iterator<std::pair<const_cmLinkItem,_unsigned_long>_>,_bool> pVar8;
  pair<unsigned_long,_bool> pVar9;
  bool local_1a9;
  bool local_189;
  undefined1 local_188 [8];
  BFSEntry qe_1;
  cmValue val;
  string var;
  BFSEntry qe;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  cmListFileBacktrace local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_98;
  reference local_68;
  LinkEntry *entry;
  size_t index;
  _Base_ptr local_50;
  undefined1 local_48;
  _Rb_tree_iterator<std::pair<const_cmLinkItem,_unsigned_long>_> local_40;
  pair<std::_Rb_tree_iterator<std::pair<const_cmLinkItem,_unsigned_long>_>,_bool> lei;
  size_t groupIndex_local;
  cmLinkItem *item_local;
  cmComputeLinkDepends *this_local;
  bool local_10;
  
  lei._8_8_ = groupIndex;
  pVar8 = AllocateLinkEntry(this,item);
  local_50 = (_Base_ptr)pVar8.first._M_node;
  local_48 = pVar8.second;
  local_40._M_node = local_50;
  lei.first._M_node._0_1_ = local_48;
  if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_cmLinkItem,_unsigned_long>_>::operator->
                       (&local_40);
    index._7_1_ = 0;
    std::pair<unsigned_long,_bool>::pair<unsigned_long_&,_bool,_true>
              ((pair<unsigned_long,_bool> *)&this_local,&ppVar3->second,(bool *)((long)&index + 7));
    uVar7 = extraout_RDX;
  }
  else {
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_cmLinkItem,_unsigned_long>_>::operator->
                       (&local_40);
    entry = (LinkEntry *)ppVar3->second;
    local_68 = std::
               vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
               ::operator[](&this->EntryList,(size_type)entry);
    psVar4 = cmLinkItem::AsStr_abi_cxx11_(item);
    std::__cxx11::string::string((string *)&local_b8,(string *)psVar4);
    cmListFileBacktrace::cmListFileBacktrace(&local_c8,&item->Backtrace);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
              (&local_98,&local_b8,&local_c8);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::operator=
              (&local_68->Item,&local_98);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
              (&local_98);
    cmListFileBacktrace::~cmListFileBacktrace(&local_c8);
    std::__cxx11::string::~string((string *)&local_b8);
    local_68->Target = item->Target;
    std::__cxx11::string::operator=((string *)&local_68->Feature,(string *)&item->Feature);
    bVar2 = false;
    local_1a9 = false;
    if (local_68->Target == (cmGeneratorTarget *)0x0) {
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_68);
      local_1a9 = false;
      if (*pcVar5 == '-') {
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_68);
        local_1a9 = false;
        if (*pcVar5 != 'l') {
          std::__cxx11::string::substr((ulong)&local_f8,(ulong)local_68);
          bVar2 = true;
          local_1a9 = std::operator!=(&local_f8,"-framework");
        }
      }
    }
    if (bVar2) {
      std::__cxx11::string::~string((string *)&local_f8);
    }
    if (local_1a9 == false) {
      str = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_68);
      sVar1._M_str = DAT_018089a8;
      sVar1._M_len = (anonymous_namespace)::LG_BEGIN;
      bVar2 = cmHasPrefix(str,sVar1);
      if (bVar2) {
        sVar1 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_68);
        bVar2 = cmHasSuffix(sVar1,'>');
        if (bVar2) {
          local_68->Kind = Group;
        }
      }
    }
    else {
      local_68->Kind = Flag;
      std::__cxx11::string::operator=
                ((string *)&local_68->Feature,(string *)&cmLinkItem::DEFAULT_abi_cxx11_);
    }
    if (local_68->Kind != Group) {
      if (local_68->Target == (cmGeneratorTarget *)0x0) {
        cmStrCat<std::__cxx11::string&,char_const(&)[13]>
                  ((string *)&val,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                   (char (*) [13])"_LIB_DEPENDS");
        qe_1.LibDepends = (char *)cmMakefile::GetDefinition(this->Makefile,(string *)&val);
        bVar2 = cmValue::operator_cast_to_bool((cmValue *)&qe_1.LibDepends);
        if (bVar2) {
          local_188 = (undefined1  [8])entry;
          qe_1.Index = lei._8_8_;
          cmValue::operator->[abi_cxx11_((cmValue *)&qe_1.LibDepends);
          qe_1.GroupIndex = std::__cxx11::string::c_str();
          std::
          queue<cmComputeLinkDepends::BFSEntry,_std::deque<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>_>
          ::push(&this->BFSQueue,(value_type *)local_188);
        }
        else if (local_68->Kind != Flag) {
          pvVar6 = std::
                   vector<cmComputeLinkDepends::DependSetList,_std::allocator<cmComputeLinkDepends::DependSetList>_>
                   ::operator[](&this->InferredDependSets,(size_type)entry);
          pvVar6->Initialized = true;
        }
        std::__cxx11::string::~string((string *)&val);
      }
      else {
        var.field_2._8_8_ = entry;
        std::
        queue<cmComputeLinkDepends::BFSEntry,_std::deque<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>_>
        ::push(&this->BFSQueue,(value_type *)((long)&var.field_2 + 8));
      }
    }
    local_189 = true;
    std::pair<unsigned_long,_bool>::pair<unsigned_long_&,_bool,_true>
              ((pair<unsigned_long,_bool> *)&this_local,(unsigned_long *)&entry,&local_189);
    uVar7 = extraout_RDX_00;
  }
  pVar9._9_7_ = (undefined7)((ulong)uVar7 >> 8);
  pVar9.second = local_10;
  pVar9.first = (unsigned_long)this_local;
  return pVar9;
}

Assistant:

std::pair<size_t, bool> cmComputeLinkDepends::AddLinkEntry(
  cmLinkItem const& item, size_t groupIndex)
{
  // Allocate a spot for the item entry.
  auto lei = this->AllocateLinkEntry(item);

  // Check if the item entry has already been added.
  if (!lei.second) {
    // Yes.  We do not need to follow the item's dependencies again.
    return { lei.first->second, false };
  }

  // Initialize the item entry.
  size_t index = lei.first->second;
  LinkEntry& entry = this->EntryList[index];
  entry.Item = BT<std::string>(item.AsStr(), item.Backtrace);
  entry.Target = item.Target;
  entry.Feature = item.Feature;
  if (!entry.Target && entry.Item.Value[0] == '-' &&
      entry.Item.Value[1] != 'l' &&
      entry.Item.Value.substr(0, 10) != "-framework") {
    entry.Kind = LinkEntry::Flag;
    entry.Feature = LinkEntry::DEFAULT;
  } else if (cmHasPrefix(entry.Item.Value, LG_BEGIN) &&
             cmHasSuffix(entry.Item.Value, '>')) {
    entry.Kind = LinkEntry::Group;
  }

  if (entry.Kind != LinkEntry::Group) {
    // If the item has dependencies queue it to follow them.
    if (entry.Target) {
      // Target dependencies are always known.  Follow them.
      BFSEntry qe = { index, groupIndex, nullptr };
      this->BFSQueue.push(qe);
    } else {
      // Look for an old-style <item>_LIB_DEPENDS variable.
      std::string var = cmStrCat(entry.Item.Value, "_LIB_DEPENDS");
      if (cmValue val = this->Makefile->GetDefinition(var)) {
        // The item dependencies are known.  Follow them.
        BFSEntry qe = { index, groupIndex, val->c_str() };
        this->BFSQueue.push(qe);
      } else if (entry.Kind != LinkEntry::Flag) {
        // The item dependencies are not known.  We need to infer them.
        this->InferredDependSets[index].Initialized = true;
      }
    }
  }

  return { index, true };
}